

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_chronicle.cpp
# Opt level: O3

int64_t __thiscall cornelich::vanilla_chronicle::last_index(vanilla_chronicle *this)

{
  vanilla_index *this_00;
  int32_t cycle;
  int32_t iVar1;
  long lVar2;
  int64_t iVar3;
  region_ptr region;
  undefined1 local_38 [16];
  
  this_00 = &this->m_index;
  cycle = vanilla_index::find_last_cycle(this_00);
  iVar3 = -1;
  if (cycle != -1) {
    iVar1 = vanilla_index::last_index_file_number(this_00,cycle,-1);
    if (iVar1 != -1) {
      vanilla_index::index_for((vanilla_index *)local_38,(int32_t)this_00,cycle,SUB41(iVar1,0));
      if ((vanilla_chronicle_settings *)local_38._0_8_ == (vanilla_chronicle_settings *)0x0) {
        iVar3 = -1;
      }
      else {
        iVar3 = vanilla_index::count_index_entries((region *)local_38._0_8_);
        lVar2 = 0;
        if (0 < iVar3) {
          lVar2 = iVar3 + -1;
        }
        iVar3 = ((long)iVar1 << ((byte)this->m_index_block_size_bits & 0x3f)) +
                ((long)cycle << ((byte)this->m_entries_for_cycle_bits & 0x3f)) + lVar2;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_);
      }
    }
  }
  return iVar3;
}

Assistant:

std::int64_t vanilla_chronicle::last_index()
{
    const auto last_cycle = m_index.find_last_cycle();
    if(last_cycle == -1)
        return -1;

    const auto last_file = m_index.last_index_file_number(last_cycle, -1);
    if(last_file == -1)
        return -1;

    const auto region = m_index.index_for(last_cycle, last_file, false);
    if(!region)
        return -1;
    const auto count_entries = vanilla_index::count_index_entries(*region);
    const auto index_entry_number = (count_entries > 0) ? count_entries - 1 : 0;

    return (static_cast<std::int64_t>(last_cycle) <<  m_entries_for_cycle_bits) +
           (static_cast<std::int64_t>(last_file) << m_index_block_size_bits) +
           index_entry_number;
}